

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

void __thiscall wallet::SQLiteDatabase::Open(SQLiteDatabase *this)

{
  sqlite3 **ppsVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  sqlite3 *psVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  Logger *this_00;
  runtime_error *prVar9;
  char **ppcVar10;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  sqlite3_stmt *check_main_stmt;
  Level in_stack_ffffffffffffff38;
  path *ppVar11;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  char *local_b0;
  string local_a8;
  path local_88;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppsVar1 = &this->m_db;
  if (this->m_db == (sqlite3 *)0x0) {
    bVar6 = this->m_mock;
    if (bVar6 == false) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_60,&this->m_dir_path,auto_format);
      std::filesystem::__cxx11::path::path(&local_88,&local_60);
      std::filesystem::__cxx11::path::~path(&local_60);
      TryCreateDirectories((path *)&local_88);
      std::filesystem::__cxx11::path::~path(&local_88);
    }
    ppcVar10 = (char **)0x0;
    iVar7 = sqlite3_open_v2((this->m_file_path)._M_dataplus._M_p,ppsVar1,(uint)bVar6 << 7 | 0x10006)
    ;
    if (iVar7 != 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_88._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar7);
      tinyformat::format<char_const*>
                (&local_60._M_pathname,(tinyformat *)"SQLiteDatabase: Failed to open database: %s\n"
                 ,(char *)&local_88,ppcVar10);
      std::runtime_error::runtime_error(prVar9,(string *)&local_60);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00c6e270;
    }
    iVar7 = sqlite3_extended_result_codes(*ppsVar1,1);
    if (iVar7 != 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_88._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar7);
      tinyformat::format<char_const*>
                (&local_60._M_pathname,
                 (tinyformat *)"SQLiteDatabase: Failed to enable extended result codes: %s\n",
                 (char *)&local_88,ppcVar10);
      std::runtime_error::runtime_error(prVar9,(string *)&local_60);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00c6e270;
    }
    this_00 = LogInstance();
    bVar6 = BCLog::Logger::WillLogCategoryLevel(this_00,WALLETDB,Trace);
    if (bVar6) {
      iVar7 = sqlite3_trace_v2(this->m_db,1,TraceSqlCallback,this);
      if (iVar7 != 0) {
        ppVar11 = &local_60;
        (*(this->super_WalletDatabase)._vptr_WalletDatabase[0xc])(ppVar11,this);
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
        ;
        source_file._M_len = 0x5a;
        logging_function._M_str = "Open";
        logging_function._M_len = 4;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function,source_file,0x10e,0x11140b8,(Level)ppVar11,
                   in_stack_ffffffffffffff40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        in_stack_ffffffffffffff38 = (Level)ppVar11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_pathname._M_dataplus._M_p != &local_60._M_pathname.field_2) {
          operator_delete(local_60._M_pathname._M_dataplus._M_p,
                          local_60._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  iVar7 = sqlite3_db_readonly(*ppsVar1,"main");
  if (iVar7 == 0) {
    psVar5 = *ppsVar1;
    paVar2 = &local_60._M_pathname.field_2;
    local_60._M_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"locking_mode","");
    paVar3 = &local_88._M_pathname.field_2;
    local_88._M_pathname._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"exclusive","");
    paVar4 = &local_a8.field_2;
    local_a8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Unable to change database locking mode to exclusive","");
    SetPragma(psVar5,&local_60._M_pathname,&local_88._M_pathname,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar4) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_pathname._M_dataplus._M_p != paVar3) {
      operator_delete(local_88._M_pathname._M_dataplus._M_p,
                      local_88._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_pathname._M_dataplus._M_p,
                      local_60._M_pathname.field_2._M_allocated_capacity + 1);
    }
    iVar7 = sqlite3_exec(*ppsVar1,"BEGIN EXCLUSIVE TRANSACTION",0,0,0);
    if (iVar7 == 0) {
      ppcVar10 = (char **)0x0;
      iVar7 = sqlite3_exec(*ppsVar1,"COMMIT",0,0,0);
      if (iVar7 == 0) {
        psVar5 = *ppsVar1;
        paVar2 = &local_60._M_pathname.field_2;
        local_60._M_pathname._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"fullfsync","");
        local_88._M_pathname._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"true","");
        local_a8._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Failed to enable fullfsync","");
        SetPragma(psVar5,&local_60._M_pathname,&local_88._M_pathname,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar4) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_pathname._M_dataplus._M_p != paVar3) {
          operator_delete(local_88._M_pathname._M_dataplus._M_p,
                          local_88._M_pathname.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_pathname._M_dataplus._M_p != paVar2) {
          operator_delete(local_60._M_pathname._M_dataplus._M_p,
                          local_60._M_pathname.field_2._M_allocated_capacity + 1);
        }
        if (this->m_use_unsafe_sync == true) {
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
          ;
          source_file_00._M_len = 0x5a;
          logging_function_00._M_str = "Open";
          logging_function_00._M_len = 4;
          ::LogPrintf_<>(logging_function_00,source_file_00,0x129,0x111426c,
                         in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
          psVar5 = *ppsVar1;
          local_60._M_pathname._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"synchronous","");
          local_88._M_pathname._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"OFF","");
          local_a8._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Failed to set synchronous mode to OFF","");
          SetPragma(psVar5,&local_60._M_pathname,&local_88._M_pathname,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar4) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_pathname._M_dataplus._M_p != paVar3) {
            operator_delete(local_88._M_pathname._M_dataplus._M_p,
                            local_88._M_pathname.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_pathname._M_dataplus._M_p != paVar2) {
            operator_delete(local_60._M_pathname._M_dataplus._M_p,
                            local_60._M_pathname.field_2._M_allocated_capacity + 1);
          }
        }
        ppcVar10 = &local_b0;
        local_b0 = (char *)0x0;
        iVar7 = sqlite3_prepare_v2(*ppsVar1,
                                   "SELECT name FROM sqlite_master WHERE type=\'table\' AND name=\'main\'"
                                   ,0xffffffff,ppcVar10,0);
        if (iVar7 == 0) {
          iVar7 = sqlite3_step(local_b0);
          iVar8 = sqlite3_finalize(local_b0);
          if (iVar8 == 0) {
            if (iVar7 != 100) {
              if (iVar7 != 0x65) {
                prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_88._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar7);
                tinyformat::format<char_const*>
                          (&local_60._M_pathname,
                           (tinyformat *)
                           "SQLiteDatabase: Failed to execute statement to check table existence: %s\n"
                           ,(char *)&local_88,ppcVar10);
                std::runtime_error::runtime_error(prVar9,(string *)&local_60);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_00c6e270;
              }
              ppcVar10 = (char **)0x0;
              iVar7 = sqlite3_exec(*ppsVar1,
                                   "CREATE TABLE main(key BLOB PRIMARY KEY NOT NULL, value BLOB NOT NULL)"
                                   ,0,0,0);
              if (iVar7 != 0) {
                prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_88._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar7);
                tinyformat::format<char_const*>
                          (&local_60._M_pathname,
                           (tinyformat *)"SQLiteDatabase: Failed to create new database: %s\n",
                           (char *)&local_88,ppcVar10);
                std::runtime_error::runtime_error(prVar9,(string *)&local_60);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_00c6e270;
              }
              Params();
              psVar5 = *ppsVar1;
              local_60._M_pathname._M_dataplus._M_p = (pointer)&local_60._M_pathname.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_60,"application_id","");
              tinyformat::format<int>(&local_88._M_pathname,"%d",(int *)&stack0xffffffffffffff4c);
              paVar2 = &local_60._M_pathname.field_2;
              local_a8._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"Failed to set the application id","");
              SetPragma(psVar5,&local_60._M_pathname,&local_88._M_pathname,&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != paVar4) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_pathname._M_dataplus._M_p != paVar3) {
                operator_delete(local_88._M_pathname._M_dataplus._M_p,
                                local_88._M_pathname.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_pathname._M_dataplus._M_p != paVar2) {
                operator_delete(local_60._M_pathname._M_dataplus._M_p,
                                local_60._M_pathname.field_2._M_allocated_capacity + 1);
              }
              psVar5 = *ppsVar1;
              local_60._M_pathname._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"user_version","")
              ;
              tinyformat::format<int>(&local_88._M_pathname,"%d",&WALLET_SCHEMA_VERSION);
              local_a8._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"Failed to set the wallet schema version","");
              SetPragma(psVar5,&local_60._M_pathname,&local_88._M_pathname,&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != paVar4) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_pathname._M_dataplus._M_p != paVar3) {
                operator_delete(local_88._M_pathname._M_dataplus._M_p,
                                local_88._M_pathname.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_pathname._M_dataplus._M_p != paVar2) {
                operator_delete(local_60._M_pathname._M_dataplus._M_p,
                                local_60._M_pathname.field_2._M_allocated_capacity + 1);
              }
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              return;
            }
          }
          else {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_88._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar7);
            tinyformat::format<char_const*>
                      (&local_60._M_pathname,
                       (tinyformat *)
                       "SQLiteDatabase: Failed to finalize statement checking table existence: %s\n"
                       ,(char *)&local_88,ppcVar10);
            std::runtime_error::runtime_error(prVar9,(string *)&local_60);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        else {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_88._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar7);
          tinyformat::format<char_const*>
                    (&local_60._M_pathname,
                     (tinyformat *)
                     "SQLiteDatabase: Failed to prepare statement to check table existence: %s\n",
                     (char *)&local_88,ppcVar10);
          std::runtime_error::runtime_error(prVar9,(string *)&local_60);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      else {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_88._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar7);
        tinyformat::format<char_const*>
                  (&local_60._M_pathname,
                   (tinyformat *)"SQLiteDatabase: Unable to end exclusive lock transaction: %s\n",
                   (char *)&local_88,ppcVar10);
        std::runtime_error::runtime_error(prVar9,(string *)&local_60);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      goto LAB_00c6e270;
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar9,
               "SQLiteDatabase: Unable to obtain an exclusive lock on the database, is it being used by another instance of Bitcoin Core?\n"
              );
  }
  else {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar9,
               "SQLiteDatabase: Database opened in readonly mode but read-write permissions are needed"
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00c6e270:
  __stack_chk_fail();
}

Assistant:

void SQLiteDatabase::Open()
{
    int flags = SQLITE_OPEN_FULLMUTEX | SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE;
    if (m_mock) {
        flags |= SQLITE_OPEN_MEMORY; // In memory database for mock db
    }

    if (m_db == nullptr) {
        if (!m_mock) {
            TryCreateDirectories(fs::PathFromString(m_dir_path));
        }
        int ret = sqlite3_open_v2(m_file_path.c_str(), &m_db, flags, nullptr);
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to open database: %s\n", sqlite3_errstr(ret)));
        }
        ret = sqlite3_extended_result_codes(m_db, 1);
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to enable extended result codes: %s\n", sqlite3_errstr(ret)));
        }
        // Trace SQL statements if tracing is enabled with -debug=walletdb -loglevel=walletdb:trace
        if (LogAcceptCategory(BCLog::WALLETDB, BCLog::Level::Trace)) {
           ret = sqlite3_trace_v2(m_db, SQLITE_TRACE_STMT, TraceSqlCallback, this);
           if (ret != SQLITE_OK) {
               LogPrintf("Failed to enable SQL tracing for %s\n", Filename());
           }
        }
    }

    if (sqlite3_db_readonly(m_db, "main") != 0) {
        throw std::runtime_error("SQLiteDatabase: Database opened in readonly mode but read-write permissions are needed");
    }

    // Acquire an exclusive lock on the database
    // First change the locking mode to exclusive
    SetPragma(m_db, "locking_mode", "exclusive", "Unable to change database locking mode to exclusive");
    // Now begin a transaction to acquire the exclusive lock. This lock won't be released until we close because of the exclusive locking mode.
    int ret = sqlite3_exec(m_db, "BEGIN EXCLUSIVE TRANSACTION", nullptr, nullptr, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error("SQLiteDatabase: Unable to obtain an exclusive lock on the database, is it being used by another instance of " PACKAGE_NAME "?\n");
    }
    ret = sqlite3_exec(m_db, "COMMIT", nullptr, nullptr, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: Unable to end exclusive lock transaction: %s\n", sqlite3_errstr(ret)));
    }

    // Enable fullfsync for the platforms that use it
    SetPragma(m_db, "fullfsync", "true", "Failed to enable fullfsync");

    if (m_use_unsafe_sync) {
        // Use normal synchronous mode for the journal
        LogPrintf("WARNING SQLite is configured to not wait for data to be flushed to disk. Data loss and corruption may occur.\n");
        SetPragma(m_db, "synchronous", "OFF", "Failed to set synchronous mode to OFF");
    }

    // Make the table for our key-value pairs
    // First check that the main table exists
    sqlite3_stmt* check_main_stmt{nullptr};
    ret = sqlite3_prepare_v2(m_db, "SELECT name FROM sqlite_master WHERE type='table' AND name='main'", -1, &check_main_stmt, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: Failed to prepare statement to check table existence: %s\n", sqlite3_errstr(ret)));
    }
    ret = sqlite3_step(check_main_stmt);
    if (sqlite3_finalize(check_main_stmt) != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: Failed to finalize statement checking table existence: %s\n", sqlite3_errstr(ret)));
    }
    bool table_exists;
    if (ret == SQLITE_DONE) {
        table_exists = false;
    } else if (ret == SQLITE_ROW) {
        table_exists = true;
    } else {
        throw std::runtime_error(strprintf("SQLiteDatabase: Failed to execute statement to check table existence: %s\n", sqlite3_errstr(ret)));
    }

    // Do the db setup things because the table doesn't exist only when we are creating a new wallet
    if (!table_exists) {
        ret = sqlite3_exec(m_db, "CREATE TABLE main(key BLOB PRIMARY KEY NOT NULL, value BLOB NOT NULL)", nullptr, nullptr, nullptr);
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to create new database: %s\n", sqlite3_errstr(ret)));
        }

        // Set the application id
        uint32_t app_id = ReadBE32(Params().MessageStart().data());
        SetPragma(m_db, "application_id", strprintf("%d", static_cast<int32_t>(app_id)),
                  "Failed to set the application id");

        // Set the user version
        SetPragma(m_db, "user_version", strprintf("%d", WALLET_SCHEMA_VERSION),
                  "Failed to set the wallet schema version");
    }
}